

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O3

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  mbedtls_mpi_uint *pmVar4;
  ulong uVar5;
  
  uVar2 = count >> 6;
  bVar1 = (byte)count & 0x3f;
  if ((uVar2 <= limbs) && ((count & 0x3f) == 0 || limbs != uVar2)) {
    if (0x3f < count) {
      uVar3 = limbs - uVar2;
      pmVar4 = X;
      uVar5 = uVar3;
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        do {
          *pmVar4 = pmVar4[uVar2];
          uVar5 = uVar5 - 1;
          pmVar4 = pmVar4 + 1;
        } while (uVar5 != 0);
      }
      if (uVar3 <= limbs && limbs - uVar3 != 0) {
        switchD_012e3010::default(X + uVar3,0,(limbs - uVar3) * 8);
      }
    }
    if (((count & 0x3f) != 0) && (limbs != 0)) {
      uVar2 = 0;
      do {
        uVar5 = X[limbs - 1];
        X[limbs - 1] = uVar5 >> bVar1 | uVar2;
        limbs = limbs - 1;
        uVar2 = uVar5 << (0x40 - bVar1 & 0x3f);
      } while (limbs != 0);
    }
    return;
  }
  switchD_012e3010::default(X,0,limbs << 3);
  return;
}

Assistant:

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if (v0 > limbs || (v0 == limbs && v1 > 0)) {
        memset(X, 0, limbs * ciL);
        return;
    }

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = 0; i < limbs - v0; i++) {
            X[i] = X[i + v0];
        }

        for (; i < limbs; i++) {
            X[i] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = limbs; i > 0; i--) {
            r1 = X[i - 1] << (biL - v1);
            X[i - 1] >>= v1;
            X[i - 1] |= r0;
            r0 = r1;
        }
    }
}